

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  uint uVar1;
  ma_bool32 mVar2;
  ma_dr_flac *in_RSI;
  long in_RDI;
  ma_uint32 currentFLACFramePCMFramesConsumed;
  ma_uint32 currentFLACFramePCMFrameCount;
  ma_uint32 offsetAbs;
  ma_uint32 offset;
  ma_uint64 originalPCMFrame;
  ma_uint64 in_stack_00000018;
  ma_bool32 wasSuccessful;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_bool32 mVar3;
  
  if (in_RDI == 0) {
    mVar3 = 0;
  }
  else if (*(ma_dr_flac **)(in_RDI + 0xe8) == in_RSI) {
    mVar3 = 1;
  }
  else if (*(long *)(in_RDI + 0xf0) == 0) {
    mVar3 = 0;
  }
  else if (in_RSI == (ma_dr_flac *)0x0) {
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    mVar3 = ma_dr_flac__seek_to_first_frame
                      ((ma_dr_flac *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    mVar3 = 0;
    if (*(ma_dr_flac **)(in_RDI + 0x38) < in_RSI) {
      in_RSI = *(ma_dr_flac **)(in_RDI + 0x38);
    }
    if (*(ma_dr_flac **)(in_RDI + 0xe8) < in_RSI) {
      uVar1 = (int)in_RSI - (int)*(undefined8 *)(in_RDI + 0xe8);
      if (uVar1 < *(uint *)(in_RDI + 0x60)) {
        *(uint *)(in_RDI + 0x60) = *(int *)(in_RDI + 0x60) - uVar1;
        *(ma_dr_flac **)(in_RDI + 0xe8) = in_RSI;
        return 1;
      }
    }
    else {
      uVar1 = (int)*(undefined8 *)(in_RDI + 0xe8) - (int)in_RSI;
      if (uVar1 < (uint)*(ushort *)(in_RDI + 0x58) - *(int *)(in_RDI + 0x60)) {
        *(uint *)(in_RDI + 0x60) = uVar1 + *(int *)(in_RDI + 0x60);
        *(ma_dr_flac **)(in_RDI + 0xe8) = in_RSI;
        return 1;
      }
    }
    if (*(int *)(in_RDI + 0x40) == 1) {
      mVar3 = ma_dr_flac_ogg__seek_to_pcm_frame(pFlac,pcmFrameIndex);
    }
    else {
      if ((*(byte *)(in_RDI + 0x128) & 1) == 0) {
        mVar3 = ma_dr_flac__seek_to_pcm_frame__seek_table
                          ((ma_dr_flac *)pcmFrameIndex,in_stack_00000018);
      }
      if (((mVar3 == 0) && ((*(byte *)(in_RDI + 0x128) >> 1 & 1) == 0)) &&
         (*(long *)(in_RDI + 0x38) != 0)) {
        mVar3 = ma_dr_flac__seek_to_pcm_frame__binary_search
                          (in_RSI,(ulong)in_stack_ffffffffffffffe0);
      }
      if ((mVar3 == 0) && ((*(byte *)(in_RDI + 0x128) >> 2 & 1) == 0)) {
        mVar3 = ma_dr_flac__seek_to_pcm_frame__brute_force
                          (_currentFLACFramePCMFramesConsumed,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
    }
    if (mVar3 == 0) {
      mVar2 = ma_dr_flac_seek_to_pcm_frame(in_RSI,(ulong)in_stack_ffffffffffffffe0);
      if (mVar2 == 0) {
        ma_dr_flac_seek_to_pcm_frame(in_RSI,CONCAT44(mVar3,in_stack_ffffffffffffffe0));
      }
    }
    else {
      *(ma_dr_flac **)(in_RDI + 0xe8) = in_RSI;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    if (pFlac == NULL) {
        return MA_FALSE;
    }
    if (pFlac->currentPCMFrame == pcmFrameIndex) {
        return MA_TRUE;
    }
    if (pFlac->firstFLACFramePosInBytes == 0) {
        return MA_FALSE;
    }
    if (pcmFrameIndex == 0) {
        pFlac->currentPCMFrame = 0;
        return ma_dr_flac__seek_to_first_frame(pFlac);
    } else {
        ma_bool32 wasSuccessful = MA_FALSE;
        ma_uint64 originalPCMFrame = pFlac->currentPCMFrame;
        if (pcmFrameIndex > pFlac->totalPCMFrameCount) {
            pcmFrameIndex = pFlac->totalPCMFrameCount;
        }
        if (pcmFrameIndex > pFlac->currentPCMFrame) {
            ma_uint32 offset = (ma_uint32)(pcmFrameIndex - pFlac->currentPCMFrame);
            if (pFlac->currentFLACFrame.pcmFramesRemaining >  offset) {
                pFlac->currentFLACFrame.pcmFramesRemaining -= offset;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        } else {
            ma_uint32 offsetAbs = (ma_uint32)(pFlac->currentPCMFrame - pcmFrameIndex);
            ma_uint32 currentFLACFramePCMFrameCount = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
            ma_uint32 currentFLACFramePCMFramesConsumed = currentFLACFramePCMFrameCount - pFlac->currentFLACFrame.pcmFramesRemaining;
            if (currentFLACFramePCMFramesConsumed > offsetAbs) {
                pFlac->currentFLACFrame.pcmFramesRemaining += offsetAbs;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        }
#ifndef MA_DR_FLAC_NO_OGG
        if (pFlac->container == ma_dr_flac_container_ogg)
        {
            wasSuccessful = ma_dr_flac_ogg__seek_to_pcm_frame(pFlac, pcmFrameIndex);
        }
        else
#endif
        {
            if (!pFlac->_noSeekTableSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__seek_table(pFlac, pcmFrameIndex);
            }
#if !defined(MA_DR_FLAC_NO_CRC)
            if (!wasSuccessful && !pFlac->_noBinarySearchSeek && pFlac->totalPCMFrameCount > 0) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__binary_search(pFlac, pcmFrameIndex);
            }
#endif
            if (!wasSuccessful && !pFlac->_noBruteForceSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__brute_force(pFlac, pcmFrameIndex);
            }
        }
        if (wasSuccessful) {
            pFlac->currentPCMFrame = pcmFrameIndex;
        } else {
            if (ma_dr_flac_seek_to_pcm_frame(pFlac, originalPCMFrame) == MA_FALSE) {
                ma_dr_flac_seek_to_pcm_frame(pFlac, 0);
            }
        }
        return wasSuccessful;
    }
}